

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecTree.c
# Opt level: O1

void Acec_BoxFree(Acec_Box_t *pBox)

{
  Vec_Wec_t *pVVar1;
  void *pvVar2;
  long lVar3;
  long lVar4;
  
  pVVar1 = pBox->vAdds;
  if (pVVar1 != (Vec_Wec_t *)0x0) {
    if (0 < pVVar1->nCap) {
      lVar4 = 8;
      lVar3 = 0;
      do {
        pvVar2 = *(void **)((long)&pVVar1->pArray->nCap + lVar4);
        if (pvVar2 != (void *)0x0) {
          free(pvVar2);
          *(undefined8 *)((long)&pVVar1->pArray->nCap + lVar4) = 0;
        }
        lVar3 = lVar3 + 1;
        lVar4 = lVar4 + 0x10;
      } while (lVar3 < pVVar1->nCap);
    }
    if (pVVar1->pArray != (Vec_Int_t *)0x0) {
      free(pVVar1->pArray);
      pVVar1->pArray = (Vec_Int_t *)0x0;
    }
    pVVar1->nCap = 0;
    pVVar1->nSize = 0;
    free(pVVar1);
    pBox->vAdds = (Vec_Wec_t *)0x0;
  }
  pVVar1 = pBox->vLeafLits;
  if (pVVar1 != (Vec_Wec_t *)0x0) {
    if (0 < pVVar1->nCap) {
      lVar4 = 8;
      lVar3 = 0;
      do {
        pvVar2 = *(void **)((long)&pVVar1->pArray->nCap + lVar4);
        if (pvVar2 != (void *)0x0) {
          free(pvVar2);
          *(undefined8 *)((long)&pVVar1->pArray->nCap + lVar4) = 0;
        }
        lVar3 = lVar3 + 1;
        lVar4 = lVar4 + 0x10;
      } while (lVar3 < pVVar1->nCap);
    }
    if (pVVar1->pArray != (Vec_Int_t *)0x0) {
      free(pVVar1->pArray);
      pVVar1->pArray = (Vec_Int_t *)0x0;
    }
    pVVar1->nCap = 0;
    pVVar1->nSize = 0;
    free(pVVar1);
    pBox->vLeafLits = (Vec_Wec_t *)0x0;
  }
  pVVar1 = pBox->vRootLits;
  if (pVVar1 != (Vec_Wec_t *)0x0) {
    if (0 < pVVar1->nCap) {
      lVar4 = 8;
      lVar3 = 0;
      do {
        pvVar2 = *(void **)((long)&pVVar1->pArray->nCap + lVar4);
        if (pvVar2 != (void *)0x0) {
          free(pvVar2);
          *(undefined8 *)((long)&pVVar1->pArray->nCap + lVar4) = 0;
        }
        lVar3 = lVar3 + 1;
        lVar4 = lVar4 + 0x10;
      } while (lVar3 < pVVar1->nCap);
    }
    if (pVVar1->pArray != (Vec_Int_t *)0x0) {
      free(pVVar1->pArray);
      pVVar1->pArray = (Vec_Int_t *)0x0;
    }
    pVVar1->nCap = 0;
    pVVar1->nSize = 0;
    free(pVVar1);
    pBox->vRootLits = (Vec_Wec_t *)0x0;
  }
  pVVar1 = pBox->vUnique;
  if (pVVar1 != (Vec_Wec_t *)0x0) {
    if (0 < pVVar1->nCap) {
      lVar4 = 8;
      lVar3 = 0;
      do {
        pvVar2 = *(void **)((long)&pVVar1->pArray->nCap + lVar4);
        if (pvVar2 != (void *)0x0) {
          free(pvVar2);
          *(undefined8 *)((long)&pVVar1->pArray->nCap + lVar4) = 0;
        }
        lVar3 = lVar3 + 1;
        lVar4 = lVar4 + 0x10;
      } while (lVar3 < pVVar1->nCap);
    }
    if (pVVar1->pArray != (Vec_Int_t *)0x0) {
      free(pVVar1->pArray);
      pVVar1->pArray = (Vec_Int_t *)0x0;
    }
    pVVar1->nCap = 0;
    pVVar1->nSize = 0;
    free(pVVar1);
    pBox->vUnique = (Vec_Wec_t *)0x0;
  }
  pVVar1 = pBox->vShared;
  if (pVVar1 != (Vec_Wec_t *)0x0) {
    if (0 < pVVar1->nCap) {
      lVar4 = 8;
      lVar3 = 0;
      do {
        pvVar2 = *(void **)((long)&pVVar1->pArray->nCap + lVar4);
        if (pvVar2 != (void *)0x0) {
          free(pvVar2);
          *(undefined8 *)((long)&pVVar1->pArray->nCap + lVar4) = 0;
        }
        lVar3 = lVar3 + 1;
        lVar4 = lVar4 + 0x10;
      } while (lVar3 < pVVar1->nCap);
    }
    if (pVVar1->pArray != (Vec_Int_t *)0x0) {
      free(pVVar1->pArray);
      pVVar1->pArray = (Vec_Int_t *)0x0;
    }
    pVVar1->nCap = 0;
    pVVar1->nSize = 0;
    free(pVVar1);
    pBox->vShared = (Vec_Wec_t *)0x0;
  }
  if (pBox != (Acec_Box_t *)0x0) {
    free(pBox);
    return;
  }
  return;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    []

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Acec_BoxFree( Acec_Box_t * pBox )
{
    Vec_WecFreeP( &pBox->vAdds );
    Vec_WecFreeP( &pBox->vLeafLits );
    Vec_WecFreeP( &pBox->vRootLits );
    Vec_WecFreeP( &pBox->vUnique );
    Vec_WecFreeP( &pBox->vShared );
    ABC_FREE( pBox );
}